

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::Seal(SimpleTypeHandler<2UL> *this,DynamicObject *instance)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  DictionaryTypeHandler *pDVar2;
  undefined8 extraout_RDX;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x37];
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pDVar2,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar1;
}

Assistant:

BOOL SimpleTypeHandler<size>::Seal(DynamicObject* instance)
    {
        return ConvertToDictionaryType(instance)->Seal(instance);
    }